

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O2

void __thiscall dlib::thread_pool_implementation::thread(thread_pool_implementation *this)

{
  mutex *__mutex;
  bfp_type *this_00;
  exception_ptr *this_01;
  bool bVar1;
  task_state_type *ptVar2;
  char cVar3;
  long lVar4;
  task_state_type *item;
  int iVar5;
  exception_ptr eptr;
  thread_id_type id;
  rmutex *local_1f0;
  read_write_mutex *prStack_1e8;
  pthread_cond_t *local_1e0;
  task_state_type task;
  
  __mutex = &this->m;
  task.task_id = 0;
  task.thread_id = 0;
  task._0_8_ = __mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  id = pthread_self();
  item = (task_state_type *)&id;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
            (&this->worker_thread_ids,(unsigned_long *)item);
  auto_mutex::~auto_mutex((auto_mutex *)&task);
  task_state_type::task_state_type(&task);
  if (this->we_are_destructing == false) {
    local_1e0 = (pthread_cond_t *)&(this->task_done_signaler).cond;
    do {
      local_1f0 = (rmutex *)0x0;
      prStack_1e8 = (read_write_mutex *)0x0;
      id = (thread_id_type)__mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      while( true ) {
        lVar4 = find_ready_task(this);
        bVar1 = this->we_are_destructing;
        if ((lVar4 != -1) || (bVar1 != false)) break;
        signaler::wait(&this->task_ready_signaler,item);
      }
      iVar5 = 3;
      if ((bVar1 & 1U) == 0) {
        ptVar2 = (this->tasks).array_elements;
        iVar5 = 0;
        item = ptVar2 + lVar4;
        ptVar2[lVar4].is_being_processed = true;
        task_state_type::operator=(&task,item);
      }
      auto_mutex::~auto_mutex((auto_mutex *)&id);
      if ((bVar1 & 1U) == 0) {
        eptr._M_exception_object = (void *)0x0;
        cVar3 = (**(code **)(*task.bfp.bf_memory.data + 0x18))();
        if (cVar3 == '\0') {
          if (*(long *)((long)task.mfp0.super_mfp_kernel_1_base_class<0UL>.mp_memory.data + 8) == 0)
          {
            if (*(long *)((long)task.mfp1.super_mfp_kernel_1_base_class<1UL>.mp_memory.data + 8) ==
                0) {
              if (*(long *)((long)task.mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data + 8)
                  != 0) {
                (**(code **)(*task.mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data + 0x20))
                          (task.mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data,task.arg1,
                           task.arg2);
              }
            }
            else {
              (**(code **)(*task.mfp1.super_mfp_kernel_1_base_class<1UL>.mp_memory.data + 0x20))
                        (task.mfp1.super_mfp_kernel_1_base_class<1UL>.mp_memory.data,task.arg1);
            }
          }
          else {
            (**(code **)(*task.mfp0.super_mfp_kernel_1_base_class<0UL>.mp_memory.data + 0x20))();
          }
        }
        else {
          (**(code **)(*task.bfp.bf_memory.data + 0x10))();
        }
        local_1f0 = (rmutex *)0x0;
        prStack_1e8 = (read_write_mutex *)0x0;
        id = (thread_id_type)__mutex;
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        this_00 = &(this->tasks).array_elements[lVar4].bfp;
        *(undefined1 *)((long)(this_00 + -2) + 0x30) = 0;
        *(undefined8 *)((long)(this_00 + -2) + 0x38) = 0;
        bound_function_pointer::clear(this_00);
        mfp_kernel_1_base_class<0UL>::clear
                  (&(this->tasks).array_elements[lVar4].mfp0.super_mfp_kernel_1_base_class<0UL>);
        mfp_kernel_1_base_class<1UL>::clear
                  (&(this->tasks).array_elements[lVar4].mfp1.super_mfp_kernel_1_base_class<1UL>);
        mfp_kernel_1_base_class<2UL>::clear
                  (&(this->tasks).array_elements[lVar4].mfp2.super_mfp_kernel_1_base_class<2UL>);
        this_01 = &(this->tasks).array_elements[lVar4].eptr;
        this_01[-0x2e] = (void *)0x0;
        this_01[-0x2d] = (void *)0x0;
        item = (task_state_type *)&eptr;
        std::__exception_ptr::exception_ptr::operator=(this_01,&eptr);
        pthread_cond_broadcast(local_1e0);
        auto_mutex::~auto_mutex((auto_mutex *)&id);
        std::__exception_ptr::exception_ptr::~exception_ptr(&eptr);
        iVar5 = 0;
      }
    } while ((iVar5 == 0) && (this->we_are_destructing == false));
  }
  task_state_type::~task_state_type(&task);
  return;
}

Assistant:

void thread_pool_implementation::
    thread (
    )
    {
        {
            // save the id of this worker thread into worker_thread_ids
            auto_mutex M(m);
            thread_id_type id = get_thread_id();
            worker_thread_ids.push_back(id);
        }

        task_state_type task;
        while (we_are_destructing == false)
        {
            long idx = 0;

            // wait for a task to do 
            { auto_mutex M(m);
                while ( (idx = find_ready_task()) == -1 && we_are_destructing == false)
                    task_ready_signaler.wait();

                if (we_are_destructing)
                    break;

                tasks[idx].is_being_processed = true;
                task = tasks[idx];
            }

            std::exception_ptr eptr = nullptr;
            try
            {
                // now do the task
                if (task.bfp)
                    task.bfp();
                else if (task.mfp0)
                    task.mfp0();
                else if (task.mfp1)
                    task.mfp1(task.arg1);
                else if (task.mfp2)
                    task.mfp2(task.arg1, task.arg2);
            }
            catch(...)
            {
                eptr = std::current_exception();
            }

            // Now let others know that we finished the task.  We do this
            // by clearing out the state of this task
            { auto_mutex M(m);
                tasks[idx].is_being_processed = false;
                tasks[idx].task_id = 0;
                tasks[idx].bfp.clear();
                tasks[idx].mfp0.clear();
                tasks[idx].mfp1.clear();
                tasks[idx].mfp2.clear();
                tasks[idx].arg1 = 0;
                tasks[idx].arg2 = 0;
                tasks[idx].eptr = eptr;
                task_done_signaler.broadcast();
            }

        }
    }